

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

FrameSequence *
deqp::egl::anon_unknown_0::generateFrameSequence
          (FrameSequence *__return_storage_ptr__,
          vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
          *frameDrawType,Random *rnd,int numFrames,int width,int height)

{
  pointer __first;
  pointer __last;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  pointer __p;
  pointer pDVar6;
  DrawCommand *pDVar7;
  ulong uVar8;
  pointer __result;
  pointer pFVar9;
  pointer pFVar10;
  allocator<deqp::egl::(anonymous_namespace)::DrawCommand> *__alloc;
  _Tp_alloc_type *__alloc_00;
  Frame *extraout_RDX;
  Frame *extraout_RDX_00;
  size_t __n;
  Frame *extraout_RDX_01;
  Frame *extraout_RDX_02;
  Frame *__args;
  size_t __n_00;
  Frame *extraout_RDX_03;
  allocator<deqp::egl::(anonymous_namespace)::DrawCommand> *this;
  ulong uVar11;
  long lVar12;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *pvVar13;
  ulong uVar14;
  long lVar15;
  DrawCommand *local_c0;
  Color color;
  Frame local_a0;
  vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
  *local_80;
  Vector<int,_2> local_78;
  ulong local_70;
  long local_68;
  DrawCommand drawCommand;
  ColoredRect rect;
  
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  color.m_data[0] = (uchar)dVar1;
  color.m_data[1] = (uchar)dVar2;
  color.m_data[2] = (uchar)dVar3;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = 0;
  local_68 = 0x7ffffffffffffff8;
  __args = extraout_RDX;
  local_80 = frameDrawType;
  do {
    if ((int)local_70 == 0x18) {
      return __return_storage_ptr__;
    }
    local_a0.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (DrawCommand *)0x0;
    local_a0.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar4 = (int)local_70 * (width / 0x18);
    local_c0 = (DrawCommand *)0x0;
    pvVar13 = local_80;
    local_a0.width = numFrames;
    local_a0.height = width;
    for (lVar15 = 0;
        __last = local_a0.draws.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        iVar5 = (int)((ulong)((long)(pvVar13->
                                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar13->
                                   super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 2), lVar15 < iVar5
        ; lVar15 = lVar15 + 1) {
      iVar5 = (width / 0x18) / iVar5;
      drawCommand.rect.bottomLeft.m_data[0] = iVar5 * (int)lVar15 + iVar4;
      drawCommand.drawType = DRAWTYPE_GLES2_CLEAR;
      local_78.m_data[1] = ((int)lVar15 + 1) * iVar5 + iVar4;
      local_78.m_data[0] = numFrames;
      tcu::Vector<int,_2>::Vector(&rect.bottomLeft,(Vector<int,_2> *)&drawCommand);
      tcu::Vector<int,_2>::Vector(&rect.topRight,&local_78);
      tcu::Vector<unsigned_char,_3>::Vector(&rect.color,&color);
      drawCommand.drawType =
           (pvVar13->
           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
           )._M_impl.super__Vector_impl_data._M_start[lVar15];
      ColoredRect::ColoredRect(&drawCommand.rect,&rect);
      if (__last == local_a0.draws.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        lVar12 = (long)__last - (long)local_c0;
        if (lVar12 == local_68) {
          local_a0.draws.
          super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
          ._M_impl.super__Vector_impl_data._M_start = local_c0;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)(lVar12 / 0x18);
        pDVar6 = __p;
        if (__last == local_c0) {
          pDVar6 = (pointer)0x1;
        }
        __alloc = (allocator<deqp::egl::(anonymous_namespace)::DrawCommand> *)
                  ((long)(&(__p->rect).bottomLeft)[1].m_data + (long)(&pDVar6->rect + -1) + 4);
        if ((allocator<deqp::egl::(anonymous_namespace)::DrawCommand> *)0x555555555555554 < __alloc)
        {
          __alloc = (allocator<deqp::egl::(anonymous_namespace)::DrawCommand> *)0x555555555555555;
        }
        this = (allocator<deqp::egl::(anonymous_namespace)::DrawCommand> *)0x555555555555555;
        if (!CARRY8((ulong)pDVar6,(ulong)__p)) {
          this = __alloc;
        }
        pDVar6 = std::
                 _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                 ::_M_allocate((_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                                *)this,(size_t)local_c0);
        DrawCommand::DrawCommand((DrawCommand *)(lVar12 + (long)pDVar6),&drawCommand);
        pDVar7 = std::
                 __uninitialized_move_if_noexcept_a<deqp::egl::(anonymous_namespace)::DrawCommand*,deqp::egl::(anonymous_namespace)::DrawCommand*,std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>>
                           (local_c0,__last,pDVar6,__alloc);
        pDVar7 = std::
                 __uninitialized_move_if_noexcept_a<deqp::egl::(anonymous_namespace)::DrawCommand*,deqp::egl::(anonymous_namespace)::DrawCommand*,std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>>
                           (__last,__last,pDVar7 + 1,__alloc);
        std::
        _Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ::_M_deallocate((_Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                         *)local_c0,__p,__n);
        local_a0.draws.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar6 + (long)this;
        __args = extraout_RDX_01;
        pvVar13 = local_80;
        local_c0 = pDVar6;
      }
      else {
        DrawCommand::DrawCommand(__last,&drawCommand);
        pDVar7 = __last + 1;
        __args = extraout_RDX_00;
      }
      local_a0.draws.
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish = pDVar7;
    }
    local_a0.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = local_c0;
    pFVar10 = (__return_storage_ptr__->
              super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar10 ==
        (__return_storage_ptr__->
        super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __first = (__return_storage_ptr__->
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((long)pFVar10 - (long)__first == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar14 = (long)pFVar10 - (long)__first >> 5;
      uVar8 = uVar14;
      if (pFVar10 == __first) {
        uVar8 = 1;
      }
      uVar11 = uVar8 + uVar14;
      __alloc_00 = (_Tp_alloc_type *)0x3ffffffffffffff;
      if (0x3fffffffffffffe < uVar11) {
        uVar11 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar8,uVar14)) {
        uVar11 = 0x3ffffffffffffff;
      }
      if (uVar11 == 0) {
        __result = (pointer)0x0;
      }
      else {
        __result = (pointer)operator_new(uVar11 << 5);
        __args = extraout_RDX_02;
      }
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)(__result + uVar14),&local_a0,__args);
      pFVar9 = std::
               vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
               ::_S_relocate(__first,pFVar10,__result,__alloc_00);
      pFVar10 = std::
                vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ::_S_relocate(pFVar10,pFVar10,pFVar9 + 1,__alloc_00);
      std::
      _Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ::_M_deallocate((_Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                       *)__first,
                      (pointer)((long)(__return_storage_ptr__->
                                      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)__first >> 5),__n_00);
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_start = __result;
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_finish = pFVar10;
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar11;
    }
    else {
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)pFVar10,&local_a0,__args);
      (__return_storage_ptr__->
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      )._M_impl.super__Vector_impl_data._M_finish = pFVar10 + 1;
    }
    Frame::~Frame(&local_a0);
    local_70 = (ulong)((int)local_70 + 1);
    __args = extraout_RDX_03;
  } while( true );
}

Assistant:

FrameSequence generateFrameSequence (const vector<DrawType>& frameDrawType, de::Random& rnd, int numFrames, int width, int height)
{
	const int			frameDiff		= height / numFrames;
	const GLubyte		r				= rnd.getUint8();
	const GLubyte		g				= rnd.getUint8();
	const GLubyte		b				= rnd.getUint8();
	const Color			color			(r, g, b);
	FrameSequence		frameSequence;

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		Frame frame (width, height);

		for (int rectNdx = 0; rectNdx < (int)frameDrawType.size(); rectNdx++)
		{
			const int			rectHeight		= frameDiff / (int)frameDrawType.size();
			const ColoredRect	rect			(IVec2(0, frameNdx*frameDiff+rectNdx*rectHeight), IVec2(width, frameNdx*frameDiff+(rectNdx+1)*rectHeight), color);
			const DrawCommand	drawCommand		(frameDrawType[rectNdx], rect);

			frame.draws.push_back(drawCommand);
		}
		frameSequence.push_back(frame);
	}
	return frameSequence;
}